

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cookie.c
# Opt level: O0

int mbedtls_ssl_cookie_check
              (void *p_ctx,uchar *cookie,size_t cookie_len,uchar *cli_id,size_t cli_id_len)

{
  int iVar1;
  time_t tVar2;
  unsigned_long cookie_time;
  unsigned_long cur_time;
  mbedtls_ssl_cookie_ctx *ctx;
  uchar *p;
  undefined1 local_58 [4];
  int ret;
  uchar ref_hmac [28];
  size_t cli_id_len_local;
  uchar *cli_id_local;
  size_t cookie_len_local;
  uchar *cookie_local;
  void *p_ctx_local;
  
  p._4_4_ = 0;
  ctx = (mbedtls_ssl_cookie_ctx *)local_58;
  if ((p_ctx == (void *)0x0) || (cli_id == (uchar *)0x0)) {
    p_ctx_local._4_4_ = -0x7100;
  }
  else if (cookie_len == 0x20) {
    unique0x100000a9 = cli_id_len;
    iVar1 = ssl_cookie_hmac((mbedtls_md_context_t *)p_ctx,cookie,(uchar **)&ctx,ref_hmac + 0x14,
                            cli_id,cli_id_len);
    if (iVar1 != 0) {
      p._4_4_ = -1;
    }
    if (p._4_4_ == 0) {
      iVar1 = mbedtls_ssl_safer_memcmp(cookie + 4,local_58,0x1c);
      if (iVar1 == 0) {
        tVar2 = time((time_t *)0x0);
        if ((*(long *)((long)p_ctx + 0x18) == 0) ||
           (tVar2 - ((ulong)*cookie << 0x18 | (ulong)cookie[1] << 0x10 | (ulong)cookie[2] << 8 |
                    (ulong)cookie[3]) <= *(ulong *)((long)p_ctx + 0x18))) {
          p_ctx_local._4_4_ = 0;
        }
        else {
          p_ctx_local._4_4_ = -1;
        }
      }
      else {
        p_ctx_local._4_4_ = -1;
      }
    }
    else {
      p_ctx_local._4_4_ = p._4_4_;
    }
  }
  else {
    p_ctx_local._4_4_ = -1;
  }
  return p_ctx_local._4_4_;
}

Assistant:

int mbedtls_ssl_cookie_check( void *p_ctx,
                      const unsigned char *cookie, size_t cookie_len,
                      const unsigned char *cli_id, size_t cli_id_len )
{
    unsigned char ref_hmac[COOKIE_HMAC_LEN];
    int ret = 0;
    unsigned char *p = ref_hmac;
    mbedtls_ssl_cookie_ctx *ctx = (mbedtls_ssl_cookie_ctx *) p_ctx;
    unsigned long cur_time, cookie_time;

    if( ctx == NULL || cli_id == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    if( cookie_len != COOKIE_LEN )
        return( -1 );

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &ctx->mutex ) ) != 0 )
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR + ret );
#endif

    if( ssl_cookie_hmac( &ctx->hmac_ctx, cookie,
                         &p, p + sizeof( ref_hmac ),
                         cli_id, cli_id_len ) != 0 )
        ret = -1;

#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &ctx->mutex ) != 0 )
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR +
                MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    if( ret != 0 )
        return( ret );

    if( mbedtls_ssl_safer_memcmp( cookie + 4, ref_hmac, sizeof( ref_hmac ) ) != 0 )
        return( -1 );

#if defined(MBEDTLS_HAVE_TIME)
    cur_time = (unsigned long) mbedtls_time( NULL );
#else
    cur_time = ctx->serial;
#endif

    cookie_time = ( (unsigned long) cookie[0] << 24 ) |
                  ( (unsigned long) cookie[1] << 16 ) |
                  ( (unsigned long) cookie[2] <<  8 ) |
                  ( (unsigned long) cookie[3]       );

    if( ctx->timeout != 0 && cur_time - cookie_time > ctx->timeout )
        return( -1 );

    return( 0 );
}